

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_shortname(char *out,GCstr *str,BCLine line)

{
  char *pcVar1;
  ulong uVar2;
  int in_EDX;
  long in_RSI;
  char *__src;
  char *in_RDI;
  size_t len_1;
  size_t len;
  char *src;
  ulong local_30;
  char *local_20;
  char *local_8;
  
  pcVar1 = (char *)(in_RSI + 0x10);
  if (*pcVar1 == '=') {
    strncpy(in_RDI,(char *)(in_RSI + 0x11),0x3c);
    in_RDI[0x3b] = '\0';
  }
  else if (*pcVar1 == '@') {
    uVar2 = (ulong)(*(int *)(in_RSI + 0xc) - 1);
    local_20 = (char *)(in_RSI + 0x11);
    local_8 = in_RDI;
    if (0x3b < uVar2) {
      local_20 = local_20 + (uVar2 - 0x38);
      *in_RDI = '.';
      in_RDI[1] = '.';
      local_8 = in_RDI + 3;
      in_RDI[2] = '.';
    }
    strcpy(local_8,local_20);
  }
  else {
    for (local_30 = 0; (local_30 < 0x30 && (0x1f < (byte)pcVar1[local_30])); local_30 = local_30 + 1
        ) {
    }
    __src = "[string \"";
    if (in_EDX == -1) {
      __src = "[builtin:";
    }
    strcpy(in_RDI,__src);
    local_8 = in_RDI + 9;
    if (pcVar1[local_30] == '\0') {
      strcpy(local_8,pcVar1);
      local_8 = local_8 + local_30;
    }
    else {
      if (0x2d < local_30) {
        local_30 = 0x2d;
      }
      strncpy(local_8,pcVar1,local_30);
      strcpy(local_8 + local_30,"...");
      local_8 = local_8 + local_30 + 3;
    }
    pcVar1 = "\"]";
    if (in_EDX == -1) {
      pcVar1 = "]";
    }
    strcpy(local_8,pcVar1);
  }
  return;
}

Assistant:

void lj_debug_shortname(char *out, GCstr *str, BCLine line)
{
  const char *src = strdata(str);
  if (*src == '=') {
    strncpy(out, src+1, LUA_IDSIZE);  /* Remove first char. */
    out[LUA_IDSIZE-1] = '\0';  /* Ensures null termination. */
  } else if (*src == '@') {  /* Output "source", or "...source". */
    size_t len = str->len-1;
    src++;  /* Skip the `@' */
    if (len >= LUA_IDSIZE) {
      src += len-(LUA_IDSIZE-4);  /* Get last part of file name. */
      *out++ = '.'; *out++ = '.'; *out++ = '.';
    }
    strcpy(out, src);
  } else {  /* Output [string "string"] or [builtin:name]. */
    size_t len;  /* Length, up to first control char. */
    for (len = 0; len < LUA_IDSIZE-12; len++)
      if (((const unsigned char *)src)[len] < ' ') break;
    strcpy(out, line == ~(BCLine)0 ? "[builtin:" : "[string \""); out += 9;
    if (src[len] != '\0') {  /* Must truncate? */
      if (len > LUA_IDSIZE-15) len = LUA_IDSIZE-15;
      strncpy(out, src, len); out += len;
      strcpy(out, "..."); out += 3;
    } else {
      strcpy(out, src); out += len;
    }
    strcpy(out, line == ~(BCLine)0 ? "]" : "\"]");
  }
}